

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O3

uint64_t __thiscall double_conversion::Double::DiyFpToUint64(Double *this,DiyFp diy_fp)

{
  int iVar1;
  ulong uVar2;
  Double *pDVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = diy_fp.f_;
  uVar2 = (ulong)this >> 0x35;
  while (uVar4 = (uint)uVar5, uVar2 != 0) {
    uVar5 = (ulong)(uVar4 + 1);
    uVar2 = (ulong)this >> 0x36;
    this = (Double *)((ulong)this >> 1);
  }
  if (0x3cb < (int)uVar4) {
    return 0x7ff0000000000000;
  }
  if ((int)uVar4 < -0x432) {
    return 0;
  }
  bVar6 = ((ulong)this & 0x10000000000000) == 0;
  pDVar3 = this;
  if (bVar6 && uVar4 != 0xfffffbce) {
    do {
      this = (Double *)((long)pDVar3 * 2);
      iVar1 = (int)uVar5;
      uVar4 = iVar1 - 1;
      uVar5 = (ulong)uVar4;
      uVar2 = (ulong)pDVar3 & 0x8000000000000;
      bVar6 = uVar2 == 0;
      if (iVar1 < -0x430) break;
      pDVar3 = this;
    } while (uVar2 == 0);
  }
  uVar2 = (ulong)(uVar4 + 0x433) << 0x34;
  uVar5 = 0;
  if (!bVar6) {
    uVar5 = uVar2;
  }
  if (uVar4 != 0xfffffbce) {
    uVar5 = uVar2;
  }
  return (ulong)this & 0xfffffffffffff | uVar5;
}

Assistant:

static uint64_t DiyFpToUint64(DiyFp diy_fp) {
    uint64_t significand = diy_fp.f();
    int exponent = diy_fp.e();
    while (significand > kHiddenBit + kSignificandMask) {
      significand >>= 1;
      exponent++;
    }
    if (exponent >= kMaxExponent) {
      return kInfinity;
    }
    if (exponent < kDenormalExponent) {
      return 0;
    }
    while (exponent > kDenormalExponent && (significand & kHiddenBit) == 0) {
      significand <<= 1;
      exponent--;
    }
    uint64_t biased_exponent;
    if (exponent == kDenormalExponent && (significand & kHiddenBit) == 0) {
      biased_exponent = 0;
    } else {
      biased_exponent = static_cast<uint64_t>(exponent + kExponentBias);
    }
    return (significand & kSignificandMask) |
        (biased_exponent << kPhysicalSignificandSize);
  }